

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_module(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char cVar6;
  uint extraout_EDX;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  char *__s2;
  FILE *pFVar10;
  long lVar11;
  uint uStack_54;
  
  __s2 = p;
  if (ctx->mode == BUILD_libdef) {
    libdef_endmodule(ctx);
    obuf[0] = (uint8_t)ffid;
    obuf[1] = (uint8_t)ffasmfunc;
    optr = obuf + 3;
    obuf[2] = '\0';
    modstate = 1;
    fprintf((FILE *)ctx->fp,"#ifdef %sMODULE_%s\n","LJLIB_",p);
    fprintf((FILE *)ctx->fp,"#undef %sMODULE_%s\n","LJLIB_",p);
    __s2 = "static const lua_CFunction %s%s[] = {\n";
    fprintf((FILE *)ctx->fp,"static const lua_CFunction %s%s[] = {\n","lj_lib_cf_",p);
  }
  modnamelen = strlen(p);
  if (modnamelen < 0x50) {
    strcpy(modname,p);
    return;
  }
  libdef_module_cold_1();
  uVar9 = (ulong)extraout_EDX;
  if (extraout_EDX != 0) {
    ffasmfunc = ffasmfunc + 1;
  }
  uVar8 = extraout_EDX;
  switch(*(int *)(p + 8)) {
  case 6:
    pFVar10 = *(FILE **)(p + 0x10);
    pcVar7 = "FFDEF(%s)\n";
    break;
  case 7:
    if (modstate != 0) {
      iVar3 = modstate;
      if (regfunc == 1) {
        if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
          puVar1 = optr + 1;
          *optr = 0xfe;
          optr = puVar1;
          goto LAB_0010ae1c;
        }
        goto LAB_0010afa2;
      }
      goto LAB_0010aef5;
    }
    goto LAB_0010af9a;
  case 8:
    sVar4 = strlen(__s2);
    if (sVar4 < 0x50) {
      strcpy(funcname,__s2);
      goto LAB_0010ae1c;
    }
    libdef_func_cold_1();
LAB_0010af9a:
    libdef_func_cold_3();
LAB_0010afa2:
    libdef_func_cold_2();
  case 9:
    cVar6 = __s2[1];
    if (cVar6 != '\0') {
      lVar5 = 0;
      do {
        if (modname[lVar5] == '\0') break;
        if (cVar6 == '_') {
          __s2[lVar5 + 1] = '.';
        }
        cVar6 = __s2[lVar5 + 2];
        lVar5 = lVar5 + 1;
      } while (cVar6 != '\0');
    }
    pFVar10 = *(FILE **)(p + 0x10);
    pcVar7 = "\"%s\",\n";
    break;
  default:
    if (*(int *)(p + 8) != 5 || extraout_EDX == 0) goto LAB_0010ae1c;
    iVar3 = *(int *)(p + 0x3c);
    if (0 < (long)iVar3) {
      pFVar10 = *(FILE **)(p + 0x10);
      lVar5 = *(long *)(p + 0x78);
      lVar11 = 0;
      do {
        pcVar7 = *(char **)(lVar5 + lVar11 * 8);
        uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
        if ((((*pcVar7 == 'f') && (pcVar7[1] == 'f')) && (pcVar7[2] == '_')) &&
           (iVar2 = strcmp(pcVar7 + 3,__s2), iVar2 == 0)) {
          uStack_54 = *(int *)(*(long *)(p + 0x50) + lVar11 * 8) - *(int *)(p + 0x28);
          uVar9 = 0;
        }
        uVar8 = (uint)uVar9;
        if ((char)uVar9 == '\0') {
          fprintf(pFVar10,",\n%d",(ulong)uStack_54);
          goto LAB_0010ae1c;
        }
        lVar11 = lVar11 + 1;
      } while (iVar3 != lVar11);
    }
    libdef_func_cold_4();
    iVar3 = extraout_EAX;
LAB_0010aef5:
    if (uVar8 != 0x80) {
      if (iVar3 != 1) {
        fwrite(",\n",2,1,*(FILE **)(p + 0x10));
      }
      modstate = 2;
      pcVar7 = "lj_cf_";
      if (uVar8 != 0) {
        pcVar7 = "lj_ffh_";
      }
      fprintf(*(FILE **)(p + 0x10),"  %s%s",pcVar7,__s2);
    }
    if (regfunc == 2) {
      __s2 = "";
    }
    else {
      obuf[2] = obuf[2] + '\x01';
    }
    libdef_name(__s2,uVar8);
    goto LAB_0010ae1c;
  }
  fprintf(pFVar10,pcVar7,__s2);
LAB_0010ae1c:
  ffid = ffid + 1;
  regfunc = 0;
  return;
}

Assistant:

static void libdef_module(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    libdef_endmodule(ctx);
    optr = obuf;
    *optr++ = (uint8_t)ffid;
    *optr++ = (uint8_t)ffasmfunc;
    *optr++ = 0;  /* Hash table size. */
    modstate = 1;
    fprintf(ctx->fp, "#ifdef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "#undef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "static const lua_CFunction %s%s[] = {\n",
	    LABEL_PREFIX_LIBCF, p);
  }
  modnamelen = strlen(p);
  if (modnamelen > sizeof(modname)-1) {
    fprintf(stderr, "Error: module name too long: '%s'\n", p);
    exit(1);
  }
  strcpy(modname, p);
}